

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_lib.c
# Opt level: O0

int BIO_puts(BIO *bp,char *buf)

{
  long lVar1;
  ulong uVar2;
  int line;
  long lVar3;
  int unaff_retaddr;
  BIO *in_stack_00000008;
  size_t written;
  int ret;
  long in_stack_00000020;
  size_t *in_stack_00000028;
  char *in_stack_ffffffffffffffd0;
  char local_28 [4];
  int iVar4;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar5;
  
  _local_28 = 0;
  if (bp == (BIO *)0x0) {
    ERR_new();
    uVar2 = _local_28;
    iVar4 = (int)(_local_28 >> 0x20);
    iVar5 = iVar4;
    _local_28 = uVar2;
    ERR_set_debug((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),iVar5,
                  in_stack_ffffffffffffffd0);
    ERR_set_error(0x20,0xc0102,(char *)0x0);
    iVar5 = -1;
  }
  else if ((bp->callback == (_func_603 *)0x0) || (*(long *)(bp->callback + 0x30) == 0)) {
    ERR_new();
    uVar2 = _local_28;
    iVar4 = (int)(_local_28 >> 0x20);
    iVar5 = iVar4;
    _local_28 = uVar2;
    ERR_set_debug((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),iVar5,
                  in_stack_ffffffffffffffd0);
    ERR_set_error(0x20,0x79,(char *)0x0);
    iVar5 = -2;
  }
  else {
    if ((bp->cb_arg != (char *)0x0) ||
       (lVar3._0_4_ = bp->init, lVar3._4_4_ = bp->shutdown, lVar3 != 0)) {
      in_stack_ffffffffffffffd0 = (char *)0x0;
      lVar3 = bio_call_callback(in_stack_00000008,unaff_retaddr,
                                (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8
                                                ),(size_t)bp,(int)((ulong)buf >> 0x20),
                                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                                in_stack_00000020,in_stack_00000028);
      in_stack_ffffffffffffffe4 = (int)lVar3;
      if (in_stack_ffffffffffffffe4 < 1) {
        return in_stack_ffffffffffffffe4;
      }
    }
    if (bp->num == 0) {
      ERR_new();
      uVar2 = _local_28;
      iVar4 = (int)(_local_28 >> 0x20);
      iVar5 = iVar4;
      _local_28 = uVar2;
      ERR_set_debug((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),iVar5,
                    in_stack_ffffffffffffffd0);
      ERR_set_error(0x20,0x78,(char *)0x0);
      iVar5 = -1;
    }
    else {
      iVar5 = (**(code **)(bp->callback + 0x30))(bp,buf);
      if (0 < iVar5) {
        *(long *)&(bp->ex_data).dummy = (long)iVar5 + *(long *)&(bp->ex_data).dummy;
        _local_28 = (ulong)iVar5;
        iVar5 = 1;
      }
      if ((bp->cb_arg != (char *)0x0) ||
         (lVar1._0_4_ = bp->init, lVar1._4_4_ = bp->shutdown, lVar1 != 0)) {
        in_stack_ffffffffffffffd0 = local_28;
        lVar3 = bio_call_callback(in_stack_00000008,unaff_retaddr,
                                  (char *)CONCAT44(in_stack_fffffffffffffffc,
                                                   in_stack_fffffffffffffff8),(size_t)bp,
                                  (int)((ulong)buf >> 0x20),
                                  CONCAT44(iVar5,in_stack_ffffffffffffffe0),in_stack_00000020,
                                  in_stack_00000028);
        iVar5 = (int)lVar3;
      }
      if (0 < iVar5) {
        if (_local_28 < 0x80000000) {
          iVar5 = (int)_local_28;
        }
        else {
          ERR_new();
          uVar2 = _local_28;
          iVar4 = (int)(_local_28 >> 0x20);
          line = iVar4;
          _local_28 = uVar2;
          ERR_set_debug((char *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),line,
                        in_stack_ffffffffffffffd0);
          ERR_set_error(0x20,0x66,(char *)0x0);
          iVar5 = -1;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int BIO_puts(BIO *b, const char *buf)
{
    int ret;
    size_t written = 0;

    if (b == NULL) {
        ERR_raise(ERR_LIB_BIO, ERR_R_PASSED_NULL_PARAMETER);
        return -1;
    }
    if (b->method == NULL || b->method->bputs == NULL) {
        ERR_raise(ERR_LIB_BIO, BIO_R_UNSUPPORTED_METHOD);
        return -2;
    }

    if (HAS_CALLBACK(b)) {
        ret = (int)bio_call_callback(b, BIO_CB_PUTS, buf, 0, 0, 0L, 1L, NULL);
        if (ret <= 0)
            return ret;
    }

    if (!b->init) {
        ERR_raise(ERR_LIB_BIO, BIO_R_UNINITIALIZED);
        return -1;
    }

    ret = b->method->bputs(b, buf);

    if (ret > 0) {
        b->num_write += (uint64_t)ret;
        written = ret;
        ret = 1;
    }

    if (HAS_CALLBACK(b))
        ret = (int)bio_call_callback(b, BIO_CB_PUTS | BIO_CB_RETURN, buf, 0, 0,
                                     0L, ret, &written);

    if (ret > 0) {
        if (written > INT_MAX) {
            ERR_raise(ERR_LIB_BIO, BIO_R_LENGTH_TOO_LONG);
            ret = -1;
        } else {
            ret = (int)written;
        }
    }

    return ret;
}